

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

bool __thiscall
llvm::
DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
::LookupBucketFor<DBKeyID>
          (DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
           *this,DBKeyID *Val,DenseMapPair<DBKeyID,_llbuild::core::KeyID> **FoundBucket)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *pDVar6;
  int iVar7;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *pDVar8;
  
  if (*(int *)(this + 0x10) == 0) {
    pDVar8 = (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)0x0;
LAB_001b1512:
    bVar3 = false;
  }
  else {
    uVar1 = Val->value;
    if (0xfffffffffffffffd < uVar1) {
      __assert_fail("!KeyInfoT::isEqual(Val, EmptyKey) && !KeyInfoT::isEqual(Val, TombstoneKey) && \"Empty/Tombstone value shouldn\'t be inserted into map!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                    ,0x24d,
                    "bool llvm::DenseMapBase<llvm::DenseMap<DBKeyID, llbuild::core::KeyID>, DBKeyID, llbuild::core::KeyID, llvm::DenseMapInfo<DBKeyID>, llvm::detail::DenseMapPair<DBKeyID, llbuild::core::KeyID>>::LookupBucketFor(const LookupKeyT &, const BucketT *&) const [DerivedT = llvm::DenseMap<DBKeyID, llbuild::core::KeyID>, KeyT = DBKeyID, ValueT = llbuild::core::KeyID, KeyInfoT = llvm::DenseMapInfo<DBKeyID>, BucketT = llvm::detail::DenseMapPair<DBKeyID, llbuild::core::KeyID>, LookupKeyT = DBKeyID]"
                   );
    }
    uVar5 = (int)uVar1 * 0x25;
    iVar7 = 1;
    pDVar6 = (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)0x0;
    while( true ) {
      uVar5 = uVar5 & *(int *)(this + 0x10) - 1U;
      lVar4 = (ulong)uVar5 * 0x10;
      pDVar8 = (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)(*(long *)this + lVar4);
      uVar2 = *(ulong *)(*(long *)this + lVar4);
      bVar3 = true;
      if (uVar1 == uVar2) break;
      if (uVar2 == 0xffffffffffffffff) {
        if (pDVar6 != (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)0x0) {
          pDVar8 = pDVar6;
        }
        goto LAB_001b1512;
      }
      if (uVar2 == 0xfffffffffffffffe &&
          pDVar6 == (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)0x0) {
        pDVar6 = pDVar8;
      }
      uVar5 = uVar5 + iVar7;
      iVar7 = iVar7 + 1;
    }
  }
  *FoundBucket = pDVar8;
  return bVar3;
}

Assistant:

unsigned getNumBuckets() const {
    return NumBuckets;
  }